

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

_Bool ssh_scp_recv(void *vbuf,size_t len)

{
  int iVar1;
  size_t sVar2;
  _Bool _Var3;
  
  _Var3 = true;
  if (len != 0) {
    do {
      while (sVar2 = bufchain_size(&received_data), sVar2 != 0) {
        sVar2 = bufchain_fetch_consume_up_to(&received_data,vbuf,len);
        vbuf = (void *)((long)vbuf + sVar2);
        len = len - sVar2;
        if (len == 0) {
          return true;
        }
      }
      iVar1 = (*backend->vt->exitcode)(backend);
    } while ((iVar1 < 0) && (iVar1 = ssh_sftp_loop_iteration(), -1 < iVar1));
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

static bool ssh_scp_recv(void *vbuf, size_t len)
{
    char *buf = (char *)vbuf;
    while (len > 0) {
        while (bufchain_size(&received_data) == 0) {
            if (backend_exitcode(backend) >= 0 ||
                ssh_sftp_loop_iteration() < 0)
                return false;          /* doom */
        }

        size_t got = bufchain_fetch_consume_up_to(&received_data, buf, len);
        buf += got;
        len -= got;
    }

    return true;
}